

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::
     DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
               (AllocatorType *allocator,
               SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *obj,size_t plusSize,
               bool prefix)

{
  code *pcVar1;
  bool bVar2;
  unsigned_long uVar3;
  size_t sVar4;
  long *plVar5;
  long extraout_RDX;
  undefined8 *in_FS_OFFSET;
  code *local_58;
  FreeFuncType freeFunc;
  bool prefix_local;
  size_t plusSize_local;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *obj_local;
  AllocatorType *allocator_local;
  
  if (!prefix) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x13c,"(prefix)","prefix");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::~SmallFinalizableHeapBlockT(obj);
  if (plusSize + 0x588 < 0x588) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x141,"(sizeof(T) + plusSize >= sizeof(T))",
                       "sizeof(T) + plusSize >= sizeof(T)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  uVar3 = Math::Align<unsigned_long>(plusSize,8);
  if (plusSize != uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x144,"(plusSize == Math::Align<size_t>(plusSize, sizeof(size_t)))",
                       "plusSize == Math::Align<size_t>(plusSize, sizeof(size_t))");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  local_58 = (code *)TypeAllocatorFunc<Memory::HeapAllocator,_Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                     ::GetFreeFunc();
  plVar5 = (long *)((long)&allocator->m_privateHeap + extraout_RDX);
  if (((ulong)local_58 & 1) != 0) {
    local_58 = *(code **)(local_58 + *plVar5 + -1);
  }
  sVar4 = _AllocatorDelete<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,_(Memory::AllocatorDeleteFlags)0>
          ::Size(plusSize);
  (*local_58)(plVar5,(long)obj - plusSize,sVar4);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj, size_t plusSize, bool prefix)
{
    Assert(prefix);
    obj->~T();

    // DeleteObject can only be called when an object is allocated successfully.
    // So the add should never overflow
    Assert(sizeof(T) + plusSize >= sizeof(T));

    // NOTE: This may cause the object not be double aligned
    Assert(plusSize == Math::Align<size_t>(plusSize, sizeof(size_t)));

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(((char *)obj) - plusSize,
        _AllocatorDelete<T, deleteFlags>::Size(plusSize));
}